

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

char * curl_easy_unescape(CURL *handle,char *string,int length,int *olen)

{
  CURLcode CVar1;
  int iVar2;
  char *pcVar3;
  size_t outputlen;
  char *str;
  size_t local_20;
  char *local_18;
  
  local_18 = (char *)0x0;
  CVar1 = Curl_urldecode((SessionHandle *)handle,string,(long)length,&local_18,&local_20,false);
  pcVar3 = (char *)0x0;
  if ((CVar1 == CURLE_OK) && (pcVar3 = local_18, olen != (int *)0x0)) {
    iVar2 = curlx_uztosi(local_20);
    *olen = iVar2;
    pcVar3 = local_18;
  }
  return pcVar3;
}

Assistant:

char *curl_easy_unescape(CURL *handle, const char *string, int length,
                         int *olen)
{
  char *str = NULL;
  size_t inputlen = length;
  size_t outputlen;
  CURLcode res = Curl_urldecode(handle, string, inputlen, &str, &outputlen,
                                FALSE);
  if(res)
    return NULL;
  if(olen)
    *olen = curlx_uztosi(outputlen);
  return str;
}